

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O2

timestamp_t
duckdb::TimeBucket::OffsetWidthConvertibleToMonthsTernaryOperator::
Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>
          (interval_t bucket_width,timestamp_t ts,interval_t offset)

{
  bool bVar1;
  int32_t ts_months;
  date_t input;
  timestamp_t tVar2;
  int64_t extraout_RDX;
  interval_t iVar3;
  
  bVar1 = Value::IsFinite<duckdb::timestamp_t>(ts);
  if (bVar1) {
    iVar3.micros = extraout_RDX;
    iVar3.months = (int)offset.micros;
    iVar3.days = (int)((ulong)offset.micros >> 0x20);
    iVar3 = Interval::Invert(offset._0_8_,iVar3);
    tVar2 = Interval::Add(ts,iVar3);
    ts_months = EpochMonths<duckdb::timestamp_t>(tVar2);
    input = WidthConvertibleToMonthsCommon(bucket_width.months,ts_months,0x168);
    tVar2 = Cast::Operation<duckdb::date_t,duckdb::timestamp_t>(input);
    tVar2 = Interval::Add(tVar2,offset);
    return (timestamp_t)tVar2.value;
  }
  tVar2 = Cast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(ts);
  return (timestamp_t)tVar2.value;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts, TC offset) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int32_t ts_months = EpochMonths(Interval::Add(ts, Interval::Invert(offset)));
			return Interval::Add(Cast::template Operation<date_t, TR>(WidthConvertibleToMonthsCommon(
			                         bucket_width.months, ts_months, DEFAULT_ORIGIN_MONTHS)),
			                     offset);
		}